

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 jx9VmConfigure(jx9_vm *pVm,sxi32 nOp,__va_list_tag *ap)

{
  char cVar1;
  jx9_hashmap *pMap;
  sxu32 *psVar2;
  void *pvVar3;
  jx9_io_stream *pjVar4;
  long lVar5;
  sxu32 nKeylen;
  uint uVar6;
  sxi32 sVar7;
  sxu32 sVar8;
  sxi32 sVar9;
  undefined8 *puVar10;
  uint *puVar11;
  long *plVar12;
  jx9_value *pjVar13;
  ProcConsumer p_Var14;
  SyHashEntry *pSVar15;
  ushort **ppuVar16;
  SyString *pSVar17;
  jx9_value *pjVar18;
  int *piVar19;
  undefined8 *puVar20;
  char **zRest;
  int iVar21;
  long lVar22;
  ulong uVar23;
  char *pcVar24;
  SySet *pSet;
  int bUTF8;
  uint uVar25;
  long lVar26;
  uint uVar27;
  char *pcVar28;
  ulong uVar29;
  char *pcVar30;
  ulong uVar31;
  SyString local_160;
  SySet sHeader;
  SyBlob sWorker;
  SyString local_108;
  char *local_f8;
  uint local_f0;
  uint local_e4;
  char *local_e0;
  ulong local_d8;
  SyString sCurrent;
  SyhttpUri sUri;
  
  switch(nOp) {
  case 1:
    uVar25 = ap->gp_offset;
    uVar31 = (ulong)uVar25;
    if (uVar31 < 0x29) {
      ap->gp_offset = (uint)(uVar31 + 8);
      p_Var14 = *(ProcConsumer *)((long)ap->reg_save_area + uVar31);
      if (0x20 < uVar25) goto LAB_0011eb3d;
      puVar10 = (undefined8 *)(uVar31 + 8 + (long)ap->reg_save_area);
      ap->gp_offset = uVar25 + 0x10;
    }
    else {
      puVar10 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar10 + 1;
      p_Var14 = (ProcConsumer)*puVar10;
LAB_0011eb3d:
      puVar10 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar10 + 1;
    }
    pvVar3 = (void *)*puVar10;
    (pVm->sVmConsumer).xConsumer = p_Var14;
    (pVm->sVmConsumer).pUserData = pvVar3;
    break;
  case 2:
    uVar25 = ap->gp_offset;
    if ((ulong)uVar25 < 0x29) {
      puVar10 = (undefined8 *)((ulong)uVar25 + (long)ap->reg_save_area);
      ap->gp_offset = uVar25 + 8;
    }
    else {
      puVar10 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar10 + 1;
    }
    pcVar28 = (char *)*puVar10;
    sVar8 = SyStrlen(pcVar28);
    uVar25 = sVar8 + 1;
    uVar31 = (ulong)sVar8;
    do {
      if (uVar31 == 0) {
        uVar25 = 0;
        break;
      }
      uVar25 = uVar25 - 1;
      lVar26 = uVar31 - 1;
      uVar31 = uVar31 - 1;
    } while (pcVar28[lVar26] == '/');
    uVar31 = (ulong)uVar25;
    pcVar30 = pcVar28 + uVar31;
    while (((uVar25 = (uint)uVar31, sUri.sHost.zString = pcVar30, sUri.sHost.nByte = uVar25,
            pcVar24 = pcVar30, uVar25 != 0 &&
            (cVar1 = *pcVar28, sUri.sHost.zString = pcVar28, pcVar24 = pcVar28,
            (ulong)(long)cVar1 < 0xffffffffffffffc0)) &&
           (ppuVar16 = __ctype_b_loc(),
           (*(byte *)((long)*ppuVar16 + (long)cVar1 * 2 + 1) & 0x20) != 0))) {
      pcVar28 = pcVar28 + 1;
      uVar31 = uVar31 - 1;
    }
    do {
      uVar29 = uVar31;
      if (uVar29 == 0) {
        return 0;
      }
      cVar1 = pcVar24[uVar29 - 1];
    } while (((ulong)(long)cVar1 < 0xffffffffffffffc0) &&
            (ppuVar16 = __ctype_b_loc(), uVar31 = uVar29 - 1,
            (*(byte *)((long)*ppuVar16 + (long)cVar1 * 2 + 1) & 0x20) != 0));
    sUri.sHost.nByte = (uint)uVar29;
    pSet = &pVm->aPaths;
    goto LAB_0011ec25;
  case 3:
    pVm->bErrReport = 1;
    break;
  case 4:
    uVar25 = ap->gp_offset;
    if ((ulong)uVar25 < 0x29) {
      piVar19 = (int *)((ulong)uVar25 + (long)ap->reg_save_area);
      ap->gp_offset = uVar25 + 8;
    }
    else {
      piVar19 = (int *)ap->overflow_arg_area;
      ap->overflow_arg_area = piVar19 + 2;
    }
    if (*piVar19 - 3U < 0x3fd) {
      pVm->nMaxDepth = *piVar19;
      return 0;
    }
    return 0;
  case 5:
    uVar25 = ap->gp_offset;
    if ((ulong)uVar25 < 0x29) {
      puVar10 = (undefined8 *)((ulong)uVar25 + (long)ap->reg_save_area);
      ap->gp_offset = uVar25 + 8;
    }
    else {
      puVar10 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar10 + 1;
    }
    *(sxu32 *)*puVar10 = pVm->nOutputLen;
    break;
  case 6:
    uVar25 = ap->gp_offset;
    uVar31 = (ulong)uVar25;
    if (uVar31 < 0x29) {
      ap->gp_offset = (uint)(uVar31 + 8);
      pcVar28 = *(char **)((long)ap->reg_save_area + uVar31);
      if (uVar25 < 0x21) {
        puVar10 = (undefined8 *)(uVar31 + 8 + (long)ap->reg_save_area);
        ap->gp_offset = uVar25 + 0x10;
        goto LAB_0011ec4a;
      }
    }
    else {
      puVar10 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar10 + 1;
      pcVar28 = (char *)*puVar10;
    }
    puVar10 = (undefined8 *)ap->overflow_arg_area;
    ap->overflow_arg_area = puVar10 + 1;
LAB_0011ec4a:
    pjVar13 = (jx9_value *)*puVar10;
    sVar8 = SyStrlen(pcVar28);
    pSVar15 = SyHashGet(&pVm->hSuper,pcVar28,sVar8);
    if (pSVar15 == (SyHashEntry *)0x0) {
      pjVar18 = jx9VmReserveMemObj(pVm,(sxu32 *)&sUri);
      if (pjVar18 == (jx9_value *)0x0) {
        return -1;
      }
      jx9MemObjStore(pjVar13,pjVar18);
      sVar7 = SyHashInsert(&pVm->hSuper,pcVar28,sVar8,
                           (void *)((ulong)sUri.sHost.zString & 0xffffffff));
      return sVar7;
    }
    if (*(uint *)&pSVar15->pUserData < (pVm->aMemObj).nUsed) {
      pvVar3 = (pVm->aMemObj).pBase;
      if (pvVar3 != (void *)0x0) {
        jx9MemObjStore(pjVar13,(jx9_value *)
                               ((long)pvVar3 +
                               (ulong)(*(uint *)&pSVar15->pUserData * (pVm->aMemObj).eSize)));
        return 0;
      }
      return 0;
    }
    return 0;
  case 7:
    uVar25 = ap->gp_offset;
    uVar31 = (ulong)uVar25;
    if (uVar31 < 0x29) {
      ap->gp_offset = (uint)(uVar31 + 8);
      pcVar28 = *(char **)((long)ap->reg_save_area + uVar31);
      if (0x20 < uVar25) goto LAB_0011ecbb;
      puVar11 = (uint *)(uVar31 + 8 + (long)ap->reg_save_area);
      ap->gp_offset = uVar25 + 0x10;
    }
    else {
      puVar10 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar10 + 1;
      pcVar28 = (char *)*puVar10;
LAB_0011ecbb:
      puVar11 = (uint *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar11 + 2;
    }
    if (pcVar28 == (char *)0x0) {
      return -3;
    }
    if (*pcVar28 == '\0') {
      return -3;
    }
    local_160.nByte = *puVar11;
    if ((int)local_160.nByte < 0) {
      local_160.nByte = SyStrlen(pcVar28);
    }
    sHeader.nUsed = 0;
    sHeader.nSize = 0;
    sHeader.eSize = 0x20;
    sHeader.nCursor = 0;
    sHeader.pBase = (void *)0x0;
    sHeader.pUserData = (void *)0x0;
    iVar21 = -1;
    sWorker.pBlob = (void *)0x0;
    sWorker.nByte = 0;
    sWorker.mByte = 0;
    sWorker.nFlags = 0;
    pcVar30 = pcVar28 + local_160.nByte;
    uVar25 = local_160.nByte;
    local_160.zString = pcVar28;
    sHeader.pAllocator = &pVm->sAllocator;
    sWorker.pAllocator = &pVm->sAllocator;
    while (((pcVar24 = pcVar30, uVar25 != 0 &&
            (cVar1 = *pcVar28, pcVar24 = pcVar28, (ulong)(long)cVar1 < 0xffffffffffffffc0)) &&
           (ppuVar16 = __ctype_b_loc(),
           (*(byte *)((long)*ppuVar16 + (long)cVar1 * 2 + 1) & 0x20) != 0))) {
      pcVar28 = pcVar28 + 1;
      uVar25 = uVar25 - 1;
    }
    uVar31 = (ulong)uVar25;
    local_160.zString = pcVar24;
    local_160.nByte = uVar25;
    do {
      if (uVar31 == 0) {
        local_160.nByte = 0;
        goto LAB_0011ee7a;
      }
      cVar1 = pcVar24[uVar31 - 1];
      if (0xffffffffffffffbf < (ulong)(long)cVar1) {
        local_160.nByte = (uint)uVar31;
        goto LAB_0011ee7a;
      }
      ppuVar16 = __ctype_b_loc();
      iVar21 = iVar21 + 1;
      uVar31 = uVar31 - 1;
    } while ((*(byte *)((long)*ppuVar16 + (long)cVar1 * 2 + 1) & 0x20) != 0);
    local_160.nByte = uVar25 - iVar21;
LAB_0011ee7a:
    sVar7 = VmGetNextLine(&local_160,&local_108);
    if (sVar7 != 0) {
      return sVar7;
    }
    if ((ulong)local_108.nByte == 0) {
      return -3;
    }
    pcVar30 = local_108.zString + local_108.nByte;
    pcVar28 = local_108.zString;
    while (((pcVar28 < pcVar30 && (cVar1 = *pcVar28, (ulong)(long)cVar1 < 0xffffffffffffffc0)) &&
           (ppuVar16 = __ctype_b_loc(),
           (*(byte *)((long)*ppuVar16 + (long)cVar1 * 2 + 1) & 0x20) != 0))) {
      pcVar28 = pcVar28 + 1;
    }
    lVar26 = 0;
    while ((pcVar24 = pcVar28 + lVar26, pcVar24 < pcVar30 &&
           (ppuVar16 = __ctype_b_loc(),
           (*(byte *)((long)*ppuVar16 + (long)*pcVar24 * 2 + 1) & 0x20) == 0))) {
      lVar26 = lVar26 + 1;
    }
    if (pcVar28 < pcVar24) {
      lVar5 = 0;
      do {
        lVar22 = lVar5;
        if (lVar22 == 0x10) goto LAB_0011ef37;
        sVar7 = SyStrnicmp((char *)((long)&VmHttpProcessFirstLine_azMethods_rel +
                                   (long)*(int *)((long)&VmHttpProcessFirstLine_azMethods_rel +
                                                 lVar22)),pcVar28,(sxu32)lVar26);
        lVar5 = lVar22 + 4;
      } while (sVar7 != 0);
      iVar21 = *(int *)((long)&VmHttpProcessFirstLine_aMethods + lVar22);
    }
    else {
LAB_0011ef37:
      iVar21 = 5;
    }
    while (((pcVar24 < pcVar30 && (cVar1 = *pcVar24, (ulong)(long)cVar1 < 0xffffffffffffffc0)) &&
           (ppuVar16 = __ctype_b_loc(),
           (*(byte *)((long)*ppuVar16 + (long)cVar1 * 2 + 1) & 0x20) != 0))) {
      pcVar24 = pcVar24 + 1;
    }
    lVar26 = 0;
    while ((pcVar28 = pcVar24 + lVar26, pcVar28 < pcVar30 &&
           (ppuVar16 = __ctype_b_loc(),
           (*(byte *)((long)*ppuVar16 + (long)*pcVar28 * 2 + 1) & 0x20) == 0))) {
      lVar26 = lVar26 + 1;
    }
    if (pcVar24 < pcVar28) {
      VmHttpSplitURI(&sUri,pcVar24,(sxu32)lVar26);
    }
    while (((pcVar28 < pcVar30 && (cVar1 = *pcVar28, (ulong)(long)cVar1 < 0xffffffffffffffc0)) &&
           (ppuVar16 = __ctype_b_loc(),
           (*(byte *)((long)*ppuVar16 + (long)cVar1 * 2 + 1) & 0x20) != 0))) {
      pcVar28 = pcVar28 + 1;
    }
    lVar26 = 0;
    while ((pcVar24 = pcVar28 + lVar26, pcVar24 < pcVar30 &&
           (ppuVar16 = __ctype_b_loc(),
           (*(byte *)((long)*ppuVar16 + (long)*pcVar24 * 2 + 1) & 0x20) == 0))) {
      lVar26 = lVar26 + 1;
    }
    if (pcVar28 < pcVar24) {
      sVar7 = SyStrnicmp(pcVar28,"http/1.0",(sxu32)lVar26);
      local_e0 = "HTTP/1.1";
      if (sVar7 == 0) {
        local_e0 = "HTTP/1.0";
      }
    }
    else {
      local_e0 = "HTTP/1.1";
    }
    lVar26 = 0;
LAB_0011f043:
    SyZero(&local_108,0x20);
    sVar7 = VmGetNextLine(&local_160,&sCurrent);
    uVar25 = sCurrent.nByte;
    pcVar28 = sCurrent.zString;
    if (sVar7 != 0 && sCurrent.nByte == 0) goto LAB_0011f2e6;
    if (sCurrent.nByte == 0) goto LAB_0011f2d3;
    if ((lVar26 != 0) && ((sCurrent.zString[-1] == ' ' || (sCurrent.zString[-1] == '\t')))) {
      uVar31 = (ulong)*(uint *)(lVar26 + 0x18);
      while ((int)uVar31 != 0) {
        pcVar30 = *(char **)(lVar26 + 0x10);
        uVar29 = (ulong)*pcVar30;
        if ((0xffffffffffffffbf < uVar29) ||
           (ppuVar16 = __ctype_b_loc(), (*(byte *)((long)*ppuVar16 + uVar29 * 2 + 1) & 0x20) == 0))
        break;
        uVar31 = uVar31 - 1;
        *(int *)(lVar26 + 0x18) = (int)uVar31;
        *(char **)(lVar26 + 0x10) = pcVar30 + 1;
      }
      do {
        if (uVar31 == 0) goto LAB_0011f2ba;
        lVar5 = *(long *)(lVar26 + 0x10);
        uVar31 = uVar31 - 1;
        uVar29 = (ulong)*(char *)(lVar5 + (uVar31 & 0xffffffff));
        if ((0xffffffffffffffbf < uVar29) ||
           (ppuVar16 = __ctype_b_loc(), (*(byte *)((long)*ppuVar16 + uVar29 * 2 + 1) & 0x20) == 0))
        {
          uVar25 = ((int)pcVar28 + uVar25) - (int)lVar5;
          goto LAB_0011f2be;
        }
        *(int *)(lVar26 + 0x18) = (int)uVar31;
      } while( true );
    }
    sVar9 = SyByteFind(sCurrent.zString,sCurrent.nByte,0x3a,&local_e4);
    if (sVar9 == 0) {
      uVar31 = (ulong)local_e4;
      local_108.nByte = local_e4;
      pcVar30 = pcVar28;
      local_d8 = uVar31;
      while (((local_108.zString = pcVar30, (int)uVar31 != 0 &&
              (cVar1 = *pcVar30, (ulong)(long)cVar1 < 0xffffffffffffffc0)) &&
             (ppuVar16 = __ctype_b_loc(),
             (*(byte *)((long)*ppuVar16 + (long)cVar1 * 2 + 1) & 0x20) != 0))) {
        uVar31 = uVar31 - 1;
        local_108.nByte = (uint)uVar31;
        pcVar30 = pcVar30 + 1;
      }
      for (lVar26 = -1; uVar29 = uVar31 + lVar26, uVar29 != 0xffffffffffffffff; lVar26 = lVar26 + -1
          ) {
        cVar1 = pcVar30[uVar29 & 0xffffffff];
        if ((0xffffffffffffffbf < (ulong)(long)cVar1) ||
           (ppuVar16 = __ctype_b_loc(),
           (*(byte *)((long)*ppuVar16 + (long)cVar1 * 2 + 1) & 0x20) == 0)) break;
        local_108.nByte = (uint)uVar29;
      }
      uVar27 = (uint)local_d8;
      pcVar28 = pcVar28 + (uVar27 + 1);
      uVar31 = (ulong)(~uVar27 + uVar25);
      uVar6 = (uVar25 - uVar27) - 2;
      local_f0 = ~uVar27 + uVar25;
      while (((uVar25 = uVar6, local_f8 = pcVar28, (int)uVar31 != 0 &&
              (cVar1 = *pcVar28, (ulong)(long)cVar1 < 0xffffffffffffffc0)) &&
             (ppuVar16 = __ctype_b_loc(),
             (*(byte *)((long)*ppuVar16 + (long)cVar1 * 2 + 1) & 0x20) != 0))) {
        pcVar28 = pcVar28 + 1;
        uVar31 = uVar31 - 1;
        uVar6 = uVar25 - 1;
        local_f0 = uVar25;
      }
      uVar29 = 0;
      while (((uVar27 = uVar25, uVar31 != uVar29 &&
              (cVar1 = pcVar28[uVar27], (ulong)(long)cVar1 < 0xffffffffffffffc0)) &&
             (ppuVar16 = __ctype_b_loc(),
             (*(byte *)((long)*ppuVar16 + (long)cVar1 * 2 + 1) & 0x20) != 0))) {
        uVar29 = uVar29 + 1;
        uVar25 = uVar27 - 1;
        local_f0 = uVar27;
      }
      sVar9 = SySetPut(&sHeader,&local_108);
      if (sVar9 != 0) goto LAB_0011f2e6;
      if (sHeader.nUsed == 0) {
        lVar26 = 0;
      }
      else {
        lVar26 = (ulong)((sHeader.nUsed - 1) * sHeader.eSize) + (long)sHeader.pBase;
      }
    }
LAB_0011f2d3:
    if (sVar7 != 0) goto LAB_0011f2e6;
    goto LAB_0011f043;
  case 8:
  case 9:
    uVar25 = ap->gp_offset;
    uVar31 = (ulong)uVar25;
    if (uVar31 < 0x29) {
      ap->gp_offset = uVar25 + 8;
      pcVar28 = *(char **)((long)ap->reg_save_area + uVar31);
      if (0x20 < uVar25) goto LAB_0011e97a;
      ap->gp_offset = (uint)(uVar31 + 0x10);
      pcVar30 = *(char **)((long)ap->reg_save_area + uVar31 + 8);
      if (uVar25 < 0x19) {
        piVar19 = (int *)(uVar31 + 0x10 + (long)ap->reg_save_area);
        ap->gp_offset = uVar25 + 0x18;
        goto LAB_0011e995;
      }
    }
    else {
      puVar10 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar10 + 1;
      pcVar28 = (char *)*puVar10;
LAB_0011e97a:
      puVar10 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar10 + 1;
      pcVar30 = (char *)*puVar10;
    }
    piVar19 = (int *)ap->overflow_arg_area;
    ap->overflow_arg_area = piVar19 + 2;
LAB_0011e995:
    iVar21 = *piVar19;
    if (nOp == 9) {
      pcVar24 = "_ENV";
      sVar8 = 4;
    }
    else {
      pcVar24 = "_SERVER";
      sVar8 = 7;
    }
    pjVar13 = VmExtractSuper(pVm,pcVar24,sVar8);
    if (pjVar13 != (jx9_value *)0x0) {
      if ((pjVar13->iFlags & 0x40) != 0) {
        sVar7 = VmHashmapInsert((jx9_hashmap *)(pjVar13->x).pOther,pcVar28,-1,pcVar30,iVar21);
        return sVar7;
      }
      return -6;
    }
    return -6;
  case 10:
    uVar25 = ap->gp_offset;
    if ((ulong)uVar25 < 0x29) {
      puVar10 = (undefined8 *)((ulong)uVar25 + (long)ap->reg_save_area);
      ap->gp_offset = uVar25 + 8;
    }
    else {
      puVar10 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar10 + 1;
    }
    *(jx9_value **)*puVar10 = &pVm->sExec;
    break;
  case 0xb:
    uVar25 = ap->gp_offset;
    if ((ulong)uVar25 < 0x29) {
      plVar12 = (long *)((ulong)uVar25 + (long)ap->reg_save_area);
      ap->gp_offset = uVar25 + 8;
    }
    else {
      plVar12 = (long *)ap->overflow_arg_area;
      ap->overflow_arg_area = plVar12 + 1;
    }
    pjVar4 = (jx9_io_stream *)*plVar12;
    if (pjVar4 == (jx9_io_stream *)0x0) {
      return -9;
    }
    pcVar28 = pjVar4->zName;
    if (pcVar28 == (char *)0x0) {
      return -9;
    }
    if (*pcVar28 == '\0') {
      return -9;
    }
    if (pjVar4->xOpen == (_func_int_char_ptr_int_jx9_value_ptr_void_ptr_ptr *)0x0) {
      return -9;
    }
    if (pjVar4->xRead == (_func_jx9_int64_void_ptr_void_ptr_jx9_int64 *)0x0) {
      return -9;
    }
    sUri.sHost.zString = (char *)pjVar4;
    if ((pVm->pDefStream == (jx9_io_stream *)0x0) &&
       (sVar7 = SyStrnicmp(pcVar28,"file",4), sVar7 == 0)) {
      pVm->pDefStream = pjVar4;
    }
    pSet = &pVm->aIOstream;
LAB_0011ec25:
    sVar7 = SySetPut(pSet,&sUri);
    return sVar7;
  case 0xc:
    uVar25 = ap->gp_offset;
    if ((ulong)uVar25 < 0x29) {
      puVar10 = (undefined8 *)((ulong)uVar25 + (long)ap->reg_save_area);
      ap->gp_offset = uVar25 + 8;
    }
    else {
      puVar10 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar10 + 1;
    }
    pcVar28 = (char *)*puVar10;
    pjVar13 = VmExtractSuper(pVm,"argv",4);
    if (pjVar13 == (jx9_value *)0x0) {
      return -6;
    }
    if ((pjVar13->iFlags & 0x40) == 0) {
      return -6;
    }
    pMap = (jx9_hashmap *)(pjVar13->x).pOther;
    sVar7 = VmHashmapInsert(pMap,(char *)0x0,0,pcVar28,-1);
    if (pcVar28 == (char *)0x0 || sVar7 != 0) {
      return sVar7;
    }
    if (*pcVar28 != '\0') {
      if (1 < pMap->nEntry) {
        SyBlobAppend(&pVm->sArgv," ",1);
      }
      sVar8 = SyStrlen(pcVar28);
      SyBlobAppend(&pVm->sArgv,pcVar28,sVar8);
    }
    break;
  case 0xd:
    uVar25 = ap->gp_offset;
    uVar31 = (ulong)uVar25;
    if (uVar31 < 0x29) {
      ap->gp_offset = (uint)(uVar31 + 8);
      puVar10 = *(undefined8 **)((long)ap->reg_save_area + uVar31);
      if (0x20 < uVar25) goto LAB_0011eacd;
      puVar20 = (undefined8 *)(uVar31 + 8 + (long)ap->reg_save_area);
      ap->gp_offset = uVar25 + 0x10;
    }
    else {
      puVar10 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar10 + 1;
      puVar10 = (undefined8 *)*puVar10;
LAB_0011eacd:
      puVar20 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar20 + 1;
    }
    psVar2 = (sxu32 *)*puVar20;
    *puVar10 = (pVm->sConsumer).pBlob;
    *psVar2 = (pVm->sConsumer).nByte;
    break;
  default:
    return -0xd;
  }
  return 0;
LAB_0011f2ba:
  *(char **)(lVar26 + 0x10) = pcVar28;
LAB_0011f2be:
  *(uint *)(lVar26 + 0x18) = uVar25;
  goto LAB_0011f2d3;
LAB_0011f2e6:
  jx9_vm_config(pVm,8,"SERVER_PROTOCOL",local_e0,8);
  if (iVar21 == 1) {
    pcVar28 = "GET";
  }
  else if (iVar21 == 3) {
    pcVar28 = "POST";
  }
  else if (iVar21 == 4) {
    pcVar28 = "PUT";
  }
  else {
    pcVar28 = "OTHER";
    if (iVar21 == 2) {
      pcVar28 = "HEAD";
    }
  }
  jx9_vm_config(pVm,8,"REQUEST_METHOD",pcVar28,0xffffffffffffffff);
  if ((sUri.sQuery.nByte != 0) && (iVar21 == 1)) {
    jx9_vm_config(pVm,8,"QUERY_STRING");
    VmHttpSplitEncodedQuery(pVm,&sUri.sQuery,&sWorker,0);
  }
  jx9_vm_config(pVm,8,"REQUEST_URI",sUri.sRaw.zString,(ulong)sUri.sRaw.nByte);
  jx9_vm_config(pVm,8,"PATH_INFO",sUri.sPath.zString,(ulong)sUri.sPath.nByte);
  uVar31 = (ulong)sUri.sPath.nByte;
  jx9_vm_config(pVm,8,"ORIG_PATH_INFO");
  pSVar17 = VmHttpExtractHeaderValue(&sHeader,"Accept",6);
  zRest = (char **)sUri.sPath.zString;
  if (pSVar17 != (SyString *)0x0) {
    zRest = (char **)pSVar17->zString;
    uVar31 = (ulong)pSVar17->nByte;
    jx9_vm_config(pVm,8,"HTTP_ACCEPT");
  }
  pSVar17 = VmHttpExtractHeaderValue(&sHeader,"Accept-Charset",0xe);
  if (pSVar17 != (SyString *)0x0) {
    zRest = (char **)pSVar17->zString;
    uVar31 = (ulong)pSVar17->nByte;
    jx9_vm_config(pVm,8,"HTTP_ACCEPT_CHARSET");
  }
  pSVar17 = VmHttpExtractHeaderValue(&sHeader,"Accept-Encoding",0xf);
  if (pSVar17 != (SyString *)0x0) {
    zRest = (char **)pSVar17->zString;
    uVar31 = (ulong)pSVar17->nByte;
    jx9_vm_config(pVm,8,"HTTP_ACCEPT_ENCODING");
  }
  pSVar17 = VmHttpExtractHeaderValue(&sHeader,"Accept-Language",0xf);
  if (pSVar17 != (SyString *)0x0) {
    zRest = (char **)pSVar17->zString;
    uVar31 = (ulong)pSVar17->nByte;
    jx9_vm_config(pVm,8,"HTTP_ACCEPT_LANGUAGE");
  }
  pSVar17 = VmHttpExtractHeaderValue(&sHeader,"Connection",10);
  if (pSVar17 != (SyString *)0x0) {
    zRest = (char **)pSVar17->zString;
    uVar31 = (ulong)pSVar17->nByte;
    jx9_vm_config(pVm,8,"HTTP_CONNECTION");
  }
  pSVar17 = VmHttpExtractHeaderValue(&sHeader,"Host",4);
  if (pSVar17 != (SyString *)0x0) {
    zRest = (char **)pSVar17->zString;
    uVar31 = (ulong)pSVar17->nByte;
    jx9_vm_config(pVm,8,"HTTP_HOST");
  }
  pSVar17 = VmHttpExtractHeaderValue(&sHeader,"Referer",7);
  if (pSVar17 != (SyString *)0x0) {
    zRest = (char **)pSVar17->zString;
    uVar31 = (ulong)pSVar17->nByte;
    jx9_vm_config(pVm,8,"HTTP_REFERER");
  }
  pSVar17 = VmHttpExtractHeaderValue(&sHeader,"User-Agent",10);
  if (pSVar17 != (SyString *)0x0) {
    zRest = (char **)pSVar17->zString;
    uVar31 = (ulong)pSVar17->nByte;
    jx9_vm_config(pVm,8,"HTTP_USER_AGENT");
  }
  pSVar17 = VmHttpExtractHeaderValue(&sHeader,"Authorization",0xd);
  if (pSVar17 != (SyString *)0x0) {
    jx9_vm_config(pVm,8,"JX9_AUTH_DIGEST",pSVar17->zString,(ulong)pSVar17->nByte);
    zRest = (char **)pSVar17->zString;
    uVar31 = (ulong)pSVar17->nByte;
    jx9_vm_config(pVm,8,"JX9_AUTH");
  }
  pjVar13 = VmExtractSuper(pVm,"_HEADER",7);
  uVar25 = 0;
  while( true ) {
    pvVar3 = sHeader.pBase;
    if (sHeader.nUsed <= uVar25) break;
    uVar29 = (ulong)(sHeader.eSize * uVar25);
    uVar25 = uVar25 + 1;
    sHeader.nCursor = uVar25;
    if ((pjVar13 != (jx9_value *)0x0) && ((pjVar13->iFlags & 0x40) != 0)) {
      zRest = *(char ***)((long)sHeader.pBase + uVar29 + 0x10);
      uVar27 = *(uint *)((long)sHeader.pBase + uVar29 + 0x18);
      uVar31 = (ulong)uVar27;
      VmHashmapInsert((jx9_hashmap *)(pjVar13->x).pOther,*(char **)((long)sHeader.pBase + uVar29),
                      *(int *)((long)sHeader.pBase + uVar29 + 8),(char *)zRest,uVar27);
    }
    if (((*(int *)((long)pvVar3 + uVar29 + 8) == 6) &&
        (sVar7 = SyStrnicmp(*(char **)((long)pvVar3 + uVar29),"Cookie",6), sVar7 == 0)) &&
       (uVar23 = (ulong)*(uint *)((long)pvVar3 + uVar29 + 0x18), uVar23 != 0)) {
      pcVar28 = *(char **)((long)pvVar3 + uVar29 + 0x10);
      pjVar18 = VmExtractSuper(pVm,"_COOKIE",7);
      if ((pjVar18 != (jx9_value *)0x0) && ((pjVar18->iFlags & 0x40) != 0)) {
        pcVar30 = pcVar28 + uVar23;
        for (; pcVar28 < pcVar30; pcVar28 = pcVar28 + 1) {
          ppuVar16 = __ctype_b_loc();
          bUTF8 = (int)uVar31;
          zRest = (char **)(long)*pcVar28;
          if ((*(byte *)((long)*ppuVar16 + (long)zRest * 2 + 1) & 0x20) == 0) {
            sWorker._16_8_ = sWorker._16_8_ & 0xffffffff00000000;
            if ((sWorker.nFlags & 4) != 0) {
              sWorker.pBlob = (void *)0x0;
              sWorker.nByte = 0;
              sWorker.mByte = 0;
              sWorker.nFlags = sWorker.nFlags & 0xfffffffb;
            }
            sVar8 = 0xffffffff;
            for (pcVar24 = pcVar28; (pcVar24 < pcVar30 && (*pcVar24 != ';')); pcVar24 = pcVar24 + 1)
            {
              sVar8 = sVar8 + 1;
            }
            for (lVar26 = 0; (pcVar28 + lVar26 < pcVar24 && (pcVar28[lVar26] != '='));
                lVar26 = lVar26 + 1) {
              sVar8 = sVar8 - 1;
            }
            SyUriDecode(pcVar28,(sxu32)lVar26,jx9VmBlobConsumer,&sWorker,bUTF8);
            nKeylen = sWorker.nByte;
            uVar31 = sWorker._16_8_ & 0xffffffff;
            if (pcVar28 + lVar26 + 1 < pcVar24) {
              SyUriDecode(pcVar28 + lVar26 + 1,sVar8,jx9VmBlobConsumer,&sWorker,bUTF8);
              zRest = (char **)((long)sWorker.pBlob + uVar31);
              uVar31 = (ulong)(sWorker.nByte - nKeylen);
            }
            else {
              uVar31 = 0;
              zRest = (char **)0x0;
            }
            VmHashmapInsert((jx9_hashmap *)(pjVar18->x).pOther,(char *)sWorker.pBlob,nKeylen,
                            (char *)zRest,(int)uVar31);
            pcVar28 = pcVar24;
          }
        }
        uVar25 = sHeader.nCursor;
      }
    }
  }
  sHeader._24_8_ = sHeader._24_8_ & 0xffffffff;
  if (((iVar21 == 3) &&
      (pSVar17 = VmHttpExtractHeaderValue(&sHeader,"Content-Type",0xc), pSVar17 != (SyString *)0x0))
     && ((0x20 < pSVar17->nByte &&
         ((sVar7 = SyMemcmp("application/x-www-form-urlencoded",pSVar17->zString,pSVar17->nByte),
          sVar7 == 0 &&
          (pSVar17 = VmHttpExtractHeaderValue(&sHeader,"Content-Length",0xe),
          pSVar17 != (SyString *)0x0)))))) {
    local_108.zString = (char *)((ulong)local_108.zString & 0xffffffff00000000);
    SyStrToInt32(pSVar17->zString,pSVar17->nByte,&local_108,zRest);
    uVar25 = (uint)local_108.zString;
    if (0 < (int)(uint)local_108.zString) {
      uVar31 = (ulong)local_160.nByte;
      pcVar30 = local_160.zString + uVar31;
      pcVar28 = local_160.zString;
      while( true ) {
        uVar27 = (uint)uVar31;
        pcVar24 = pcVar30;
        if (((uVar27 == 0) ||
            (cVar1 = *pcVar28, pcVar24 = pcVar28, 0xffffffffffffffbf < (ulong)(long)cVar1)) ||
           (ppuVar16 = __ctype_b_loc(),
           (*(byte *)((long)*ppuVar16 + (long)cVar1 * 2 + 1) & 0x20) == 0)) break;
        pcVar28 = pcVar28 + 1;
        uVar31 = (ulong)(uVar27 - 1);
      }
      iVar21 = -1;
      local_160.zString = pcVar24;
      local_160.nByte = uVar27;
      do {
        if (uVar31 == 0) {
          uVar27 = 0;
          goto LAB_0011f8d9;
        }
        cVar1 = pcVar24[uVar31 - 1];
        if (0xffffffffffffffbf < (ulong)(long)cVar1) {
          uVar27 = (uint)uVar31;
          goto LAB_0011f8d9;
        }
        ppuVar16 = __ctype_b_loc();
        iVar21 = iVar21 + 1;
        uVar31 = uVar31 - 1;
      } while ((*(byte *)((long)*ppuVar16 + (long)cVar1 * 2 + 1) & 0x20) != 0);
      uVar27 = uVar27 - iVar21;
LAB_0011f8d9:
      local_160.nByte = uVar25;
      if ((int)uVar27 < (int)uVar25) {
        local_160.nByte = uVar27;
      }
      VmHttpSplitEncodedQuery(pVm,&local_160,&sWorker,1);
    }
  }
  SySetRelease(&sHeader);
  SyBlobRelease(&sWorker);
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 jx9VmConfigure(
	jx9_vm *pVm, /* Target VM */
	sxi32 nOp,   /* Configuration verb */
	va_list ap   /* Subsequent option arguments */
	)
{
	sxi32 rc = SXRET_OK;
	switch(nOp){
	case JX9_VM_CONFIG_OUTPUT: {
		ProcConsumer xConsumer = va_arg(ap, ProcConsumer);
		void *pUserData = va_arg(ap, void *);
		/* VM output consumer callback */
#ifdef UNTRUST
		if( xConsumer == 0 ){
			rc = SXERR_CORRUPT;
			break;
		}
#endif
		/* Install the output consumer */
		pVm->sVmConsumer.xConsumer = xConsumer;
		pVm->sVmConsumer.pUserData = pUserData;
		break;
							   }
	case JX9_VM_CONFIG_IMPORT_PATH: {
		/* Import path */
		  const char *zPath;
		  SyString sPath;
		  zPath = va_arg(ap, const char *);
#if defined(UNTRUST)
		  if( zPath == 0 ){
			  rc = SXERR_EMPTY;
			  break;
		  }
#endif
		  SyStringInitFromBuf(&sPath, zPath, SyStrlen(zPath));
		  /* Remove trailing slashes and backslashes */
#ifdef __WINNT__
		  SyStringTrimTrailingChar(&sPath, '\\');
#endif
		  SyStringTrimTrailingChar(&sPath, '/');
		  /* Remove leading and trailing white spaces */
		  SyStringFullTrim(&sPath);
		  if( sPath.nByte > 0 ){
			  /* Store the path in the corresponding conatiner */
			  rc = SySetPut(&pVm->aPaths, (const void *)&sPath);
		  }
		  break;
									 }
	case JX9_VM_CONFIG_ERR_REPORT:
		/* Run-Time Error report */
		pVm->bErrReport = 1;
		break;
	case JX9_VM_CONFIG_RECURSION_DEPTH:{
		/* Recursion depth */
		int nDepth = va_arg(ap, int);
		if( nDepth > 2 && nDepth < 1024 ){
			pVm->nMaxDepth = nDepth;
		}
		break;
									   }
	case JX9_VM_OUTPUT_LENGTH: {
		/* VM output length in bytes */
		sxu32 *pOut = va_arg(ap, sxu32 *);
#ifdef UNTRUST
		if( pOut == 0 ){
			rc = SXERR_CORRUPT;
			break;
		}
#endif
		*pOut = pVm->nOutputLen;
		break;
							   }
	case JX9_VM_CONFIG_CREATE_VAR: {
		/* Create a new superglobal/global variable */
		const char *zName = va_arg(ap, const char *);
		jx9_value *pValue = va_arg(ap, jx9_value *);
		SyHashEntry *pEntry;
		jx9_value *pObj;
		sxu32 nByte;
		sxu32 nIdx; 
#ifdef UNTRUST
		if( SX_EMPTY_STR(zName) || pValue == 0 ){
			rc = SXERR_CORRUPT;
			break;
		}
#endif
		nByte = SyStrlen(zName);
		/* Check if the superglobal is already installed */
		pEntry = SyHashGet(&pVm->hSuper, (const void *)zName, nByte);
		if( pEntry ){
			/* Variable already installed */
			nIdx = SX_PTR_TO_INT(pEntry->pUserData);
			/* Extract contents */
			pObj = (jx9_value *)SySetAt(&pVm->aMemObj, nIdx);
			if( pObj ){
				/* Overwrite old contents */
				jx9MemObjStore(pValue, pObj);
			}
		}else{
			/* Install a new variable */
			pObj = jx9VmReserveMemObj(&(*pVm),&nIdx);
			if( pObj == 0 ){
				rc = SXERR_MEM;
				break;
			}
			/* Copy value */
			jx9MemObjStore(pValue, pObj);
			/* Install the superglobal */
			rc = SyHashInsert(&pVm->hSuper, (const void *)zName, nByte, SX_INT_TO_PTR(nIdx));
		}
		break;
									}
	case JX9_VM_CONFIG_SERVER_ATTR:
	case JX9_VM_CONFIG_ENV_ATTR:  {
		const char *zKey   = va_arg(ap, const char *);
		const char *zValue = va_arg(ap, const char *);
		int nLen = va_arg(ap, int);
		jx9_hashmap *pMap;
		jx9_value *pValue;
		if( nOp == JX9_VM_CONFIG_ENV_ATTR ){
			/* Extract the $_ENV superglobal */
			pValue = VmExtractSuper(&(*pVm), "_ENV", sizeof("_ENV")-1);
		}else{
			/* Extract the $_SERVER superglobal */
			pValue = VmExtractSuper(&(*pVm), "_SERVER", sizeof("_SERVER")-1);
		}
		if( pValue == 0 || (pValue->iFlags & MEMOBJ_HASHMAP) == 0 ){
			/* No such entry */
			rc = SXERR_NOTFOUND;
			break;
		}
		/* Point to the hashmap */
		pMap = (jx9_hashmap *)pValue->x.pOther;
		/* Perform the insertion */
		rc = VmHashmapInsert(pMap, zKey, -1, zValue, nLen);
		break;
								   }
	case JX9_VM_CONFIG_ARGV_ENTRY:{
		/* Script arguments */
		const char *zValue = va_arg(ap, const char *);
		jx9_hashmap *pMap;
		jx9_value *pValue;
		/* Extract the $argv array */
		pValue = VmExtractSuper(&(*pVm), "argv", sizeof("argv")-1);
		if( pValue == 0 || (pValue->iFlags & MEMOBJ_HASHMAP) == 0 ){
			/* No such entry */
			rc = SXERR_NOTFOUND;
			break;
		}
		/* Point to the hashmap */
		pMap = (jx9_hashmap *)pValue->x.pOther;
		/* Perform the insertion */
		rc = VmHashmapInsert(pMap, 0, 0, zValue,-1);
		if( rc == SXRET_OK && zValue && zValue[0] != 0 ){
			if( pMap->nEntry > 1 ){
				/* Append space separator first */
				SyBlobAppend(&pVm->sArgv, (const void *)" ", sizeof(char));
			}
			SyBlobAppend(&pVm->sArgv, (const void *)zValue,SyStrlen(zValue));
		}
		break;
								  }
	case JX9_VM_CONFIG_EXEC_VALUE: {
		/* Script return value */
		jx9_value **ppValue = va_arg(ap, jx9_value **);
#ifdef UNTRUST
		if( ppValue == 0 ){
			rc = SXERR_CORRUPT;
			break;
		}
#endif
		*ppValue = &pVm->sExec;
		break;
								   }
	case JX9_VM_CONFIG_IO_STREAM: {
		/* Register an IO stream device */
		const jx9_io_stream *pStream = va_arg(ap, const jx9_io_stream *);
		/* Make sure we are dealing with a valid IO stream */
		if( pStream == 0 || pStream->zName == 0 || pStream->zName[0] == 0 ||
			pStream->xOpen == 0 || pStream->xRead == 0 ){
				/* Invalid stream */
				rc = SXERR_INVALID;
				break;
		}
		if( pVm->pDefStream == 0 && SyStrnicmp(pStream->zName, "file", sizeof("file")-1) == 0 ){
			/* Make the 'file://' stream the defaut stream device */
			pVm->pDefStream = pStream;
		}
		/* Insert in the appropriate container */
		rc = SySetPut(&pVm->aIOstream, (const void *)&pStream);
		break;
								  }
	case JX9_VM_CONFIG_EXTRACT_OUTPUT: {
		/* Point to the VM internal output consumer buffer */
		const void **ppOut = va_arg(ap, const void **);
		unsigned int *pLen = va_arg(ap, unsigned int *);
#ifdef UNTRUST
		if( ppOut == 0 || pLen == 0 ){
			rc = SXERR_CORRUPT;
			break;
		}
#endif
		*ppOut = SyBlobData(&pVm->sConsumer);
		*pLen  = SyBlobLength(&pVm->sConsumer);
		break;
									   }
	case JX9_VM_CONFIG_HTTP_REQUEST:{
		/* Raw HTTP request*/
		const char *zRequest = va_arg(ap, const char *);
		int nByte = va_arg(ap, int);
		if( SX_EMPTY_STR(zRequest) ){
			rc = SXERR_EMPTY;
			break;
		}
		if( nByte < 0 ){
			/* Compute length automatically */
			nByte = (int)SyStrlen(zRequest);
		}
		/* Process the request */
		rc = VmHttpProcessRequest(&(*pVm), zRequest, nByte);
		break;
									}
	default:
		/* Unknown configuration option */
		rc = SXERR_UNKNOWN;
		break;
	}
	return rc;
}